

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeTimes(ProjectWriter *this)

{
  string local_38;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[TIMES]\n");
  Options::timeOptionsToStr_abi_cxx11_(&local_38,&this->network->options);
  std::operator<<((ostream *)&this->field_0x18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ProjectWriter::writeTimes()
{
    fout << "\n[TIMES]\n";
    fout << network->options.timeOptionsToStr();
}